

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlBufferPtr xmlBufferCreate(void)

{
  uint *puVar1;
  xmlBufferAllocationScheme *pxVar2;
  xmlChar *pxVar3;
  xmlBufferPtr ret;
  
  ret = (xmlBufferPtr)(*xmlMalloc)(0x20);
  if (ret == (xmlBufferPtr)0x0) {
    xmlTreeErrMemory("creating buffer");
    ret = (xmlBufferPtr)0x0;
  }
  else {
    ret->use = 0;
    puVar1 = (uint *)__xmlDefaultBufferSize();
    ret->size = *puVar1;
    pxVar2 = __xmlBufferAllocScheme();
    ret->alloc = *pxVar2;
    pxVar3 = (xmlChar *)(*xmlMallocAtomic)((size_t)ret->size);
    ret->content = pxVar3;
    if (ret->content == (xmlChar *)0x0) {
      xmlTreeErrMemory("creating buffer");
      (*xmlFree)(ret);
      ret = (xmlBufferPtr)0x0;
    }
    else {
      *ret->content = '\0';
      ret->contentIO = (xmlChar *)0x0;
    }
  }
  return ret;
}

Assistant:

xmlBufferPtr
xmlBufferCreate(void) {
    xmlBufferPtr ret;

    ret = (xmlBufferPtr) xmlMalloc(sizeof(xmlBuffer));
    if (ret == NULL) {
	xmlTreeErrMemory("creating buffer");
        return(NULL);
    }
    ret->use = 0;
    ret->size = xmlDefaultBufferSize;
    ret->alloc = xmlBufferAllocScheme;
    ret->content = (xmlChar *) xmlMallocAtomic(ret->size);
    if (ret->content == NULL) {
	xmlTreeErrMemory("creating buffer");
	xmlFree(ret);
        return(NULL);
    }
    ret->content[0] = 0;
    ret->contentIO = NULL;
    return(ret);
}